

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  int tok;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  if (ptr == end) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_0015c4ed:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      goto LAB_0015c508;
    }
    if (bVar1 == 0) {
      bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
      if (bVar2 < 0x16) {
        if (bVar2 == 5) {
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          goto LAB_0015c508;
        }
        if (bVar2 == 6) {
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          goto LAB_0015c508;
        }
        if (bVar2 != 7) goto LAB_0015c508;
        goto LAB_0015c4ed;
      }
      if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_0015c59a;
      if (bVar2 != 0x1d) goto LAB_0015c508;
    }
  }
  else if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)ptr[1])))) goto LAB_0015c508;
  if ((*(uint *)((long)namingBitmap +
                (ulong)((byte)ptr[1] >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
       ((byte)ptr[1] & 0x1f) & 1) != 0) {
LAB_0015c59a:
    if (ptr + 2 == end) {
      return -1;
    }
    lVar4 = (long)end - (long)ptr;
    pbVar5 = (byte *)(ptr + 4);
LAB_0015c5ca:
    lVar4 = lVar4 + -2;
    bVar1 = pbVar5[-2];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if (pbVar5[-1] < 0xfe) goto switchD_0015c600_caseD_1d;
      }
      else if (3 < bVar1 - 0xdc) goto switchD_0015c600_caseD_1d;
      goto switchD_0015c600_caseD_8;
    }
    if (bVar1 != 0) {
      if (3 < bVar1 - 0xd8) goto switchD_0015c600_caseD_1d;
switchD_0015c600_caseD_7:
      if (lVar4 < 4) {
        return -2;
      }
      goto switchD_0015c600_caseD_8;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar5[-1])) {
    case 5:
      if (lVar4 < 2) {
        return -2;
      }
      break;
    case 6:
      if (lVar4 < 3) {
        return -2;
      }
      break;
    case 7:
      goto switchD_0015c600_caseD_7;
    case 9:
    case 10:
    case 0x15:
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&local_34,
                                 (int *)&switchD_0015c600::switchdataD_001d8af0);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar5 + -2);
        return 0;
      }
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      goto LAB_0015c6e5;
    case 0xf:
      iVar3 = big2_checkPiTarget((ENCODING *)ptr,(char *)(pbVar5 + -2),(char *)&local_34,
                                 (int *)&switchD_0015c600::switchdataD_001d8af0);
      if (iVar3 == 0) {
        *nextTokPtr = (char *)(pbVar5 + -2);
        return 0;
      }
      if (pbVar5 == (byte *)end) {
        return -1;
      }
      if ((*pbVar5 != 0) || (pbVar5[1] != 0x3e)) goto switchD_0015c746_caseD_0;
      pbVar5 = pbVar5 + 2;
      goto LAB_0015c7f7;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0015c600_caseD_16;
    case 0x1d:
switchD_0015c600_caseD_1d:
      if ((*(uint *)((long)namingBitmap +
                    (ulong)(pbVar5[-1] >> 3 & 0x1c |
                           (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >> (pbVar5[-1] & 0x1f)
          & 1) != 0) goto switchD_0015c600_caseD_16;
    }
switchD_0015c600_caseD_8:
    pbVar5 = pbVar5 + -2;
    goto switchD_0015c746_caseD_0;
  }
LAB_0015c508:
  *nextTokPtr = ptr;
  return 0;
switchD_0015c600_caseD_16:
  bVar7 = pbVar5 == (byte *)end;
  pbVar5 = pbVar5 + 2;
  if (bVar7) {
    return -1;
  }
  goto LAB_0015c5ca;
LAB_0015c6e5:
  bVar1 = *pbVar5;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
switchD_0015c746_caseD_7:
      if ((long)end - (long)pbVar5 < 4) {
        return -2;
      }
      pbVar6 = pbVar5 + 4;
      goto LAB_0015c76f;
    }
    if (bVar1 != 0) goto switchD_0015c746_caseD_2;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar5[1])) {
    case 0:
    case 1:
    case 8:
      goto switchD_0015c746_caseD_0;
    default:
      goto switchD_0015c746_caseD_2;
    case 5:
      if ((long)end - (long)pbVar5 < 2) {
        return -2;
      }
      goto switchD_0015c746_caseD_2;
    case 6:
      if ((long)end - (long)pbVar5 < 3) {
        return -2;
      }
      pbVar6 = pbVar5 + 3;
      break;
    case 7:
      goto switchD_0015c746_caseD_7;
    case 0xf:
      pbVar6 = pbVar5 + 2;
      if (pbVar6 == (byte *)end) {
        return -1;
      }
      if ((*pbVar6 == 0) && (pbVar5[3] == 0x3e)) {
        pbVar5 = pbVar5 + 4;
LAB_0015c7f7:
        *nextTokPtr = (char *)pbVar5;
        return local_34;
      }
    }
  }
  else {
    if (bVar1 == 0xff) {
      if (pbVar5[1] < 0xfe) goto switchD_0015c746_caseD_2;
      goto switchD_0015c746_caseD_0;
    }
    if (bVar1 - 0xdc < 4) {
switchD_0015c746_caseD_0:
      *nextTokPtr = (char *)pbVar5;
      return 0;
    }
switchD_0015c746_caseD_2:
    pbVar6 = pbVar5 + 2;
  }
LAB_0015c76f:
  pbVar5 = pbVar6;
  if (pbVar6 == (byte *)end) {
    return -1;
  }
  goto LAB_0015c6e5;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}